

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpConnection.cpp
# Opt level: O2

void __thiscall sznet::net::KcpConnection::~KcpConnection(KcpConnection *this)

{
  Channel *this_00;
  self *psVar1;
  LogStream *pLVar2;
  char *in_RSI;
  SourceFile file;
  Logger local_ff8;
  undefined1 local_28 [12];
  
  if (g_logLevel < 2) {
    Logger::SourceFile::SourceFile<104>
              ((SourceFile *)local_28,
               (char (*) [104])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpConnection.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_28._0_8_;
    file.m_size = local_28._8_4_;
    Logger::Logger(&local_ff8,file,0x3a,DEBUG,"~KcpConnection");
    psVar1 = LogStream::operator<<(&local_ff8.m_impl.m_stream,"KcpConnection::dtor[");
    psVar1 = LogStream::operator<<(psVar1,&this->m_name);
    psVar1 = LogStream::operator<<(psVar1,"] at ");
    pLVar2 = LogStream::operator<<(psVar1,this);
    psVar1 = LogStream::operator<<(pLVar2," id=");
    pLVar2 = LogStream::operator<<(psVar1,this->m_id);
    psVar1 = LogStream::operator<<(pLVar2," state=");
    in_RSI = stateToString(this);
    LogStream::operator<<(psVar1,in_RSI);
    Logger::~Logger(&local_ff8);
  }
  if (this->m_state == kDisconnected) {
    if (this->m_kcp != (ikcpcb *)0x0) {
      ikcp_release(this->m_kcp);
      this->m_kcp = (ikcpcb *)0x0;
    }
    this_00 = (this->m_udpChannel)._M_t.
              super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>.
              _M_t.
              super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
              .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl;
    if ((this_00 != (Channel *)0x0) && (this->m_isClient == true)) {
      Channel::disableAll(this_00);
      Channel::remove((this->m_udpChannel)._M_t.
                      super___uniq_ptr_impl<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_sznet::net::Channel_*,_std::default_delete<sznet::net::Channel>_>
                      .super__Head_base<0UL,_sznet::net::Channel_*,_false>._M_head_impl,in_RSI);
    }
    std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::~unique_ptr
              (&this->m_udpChannel);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&(this->m_outputBuffer).m_buffer.super__Vector_base<char,_std::allocator<char>_>);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&(this->m_inputBuffer).m_buffer.super__Vector_base<char,_std::allocator<char>_>);
    std::_Function_base::~_Function_base(&(this->m_kcpCloseCallback).super__Function_base);
    std::_Function_base::~_Function_base(&(this->m_kcpHighWaterMarkCallback).super__Function_base);
    std::_Function_base::~_Function_base(&(this->m_kcpWriteCompleteCallback).super__Function_base);
    std::_Function_base::~_Function_base(&(this->m_kcpMessageCallback).super__Function_base);
    std::_Function_base::~_Function_base(&(this->m_kcpConnectionCallback).super__Function_base);
    std::unique_ptr<sznet::net::InetAddress,_std::default_delete<sznet::net::InetAddress>_>::
    ~unique_ptr(&this->m_peerAddr);
    std::__cxx11::string::~string((string *)&this->m_name);
    Socket::~Socket(&this->m_udpSocket);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              (&(this->super_enable_shared_from_this<sznet::net::KcpConnection>)._M_weak_this.
                super___weak_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    return;
  }
  __assert_fail("m_state == kDisconnected",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpConnection.cpp"
                ,0x3d,"sznet::net::KcpConnection::~KcpConnection()");
}

Assistant:

KcpConnection::~KcpConnection()
{
	LOG_DEBUG << "KcpConnection::dtor[" << m_name << "] at " << this
		<< " id=" << m_id
		<< " state=" << stateToString();
	assert(m_state == kDisconnected);
	if (m_kcp)
	{
		ikcp_release(m_kcp);
		m_kcp = nullptr;
	}
	if (m_udpChannel && m_isClient)
	{
		m_udpChannel->disableAll();
		m_udpChannel->remove();
	}
}